

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_deserialize_struct
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool local,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  char *pcVar3;
  string sStack_48;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  pcVar3 = "";
  if ((int)CONCAT71(in_register_00000009,local) != 0) {
    pcVar3 = "local ";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2," = ");
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,":new{}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_48);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,":read(iprot)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool local,
                                                  string prefix) {
  indent(out) << (local ? "local " : "") << prefix << " = " << tstruct->get_name() << ":new{}"
              << endl << indent() << prefix << ":read(iprot)" << endl;
}